

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picobench.hpp
# Opt level: O1

benchmark * __thiscall
picobench::registry::add_benchmark(registry *this,char *name,benchmark_proc proc)

{
  iterator __position;
  vector<std::unique_ptr<picobench::benchmark_impl,std::default_delete<picobench::benchmark_impl>>,std::allocator<std::unique_ptr<picobench::benchmark_impl,std::default_delete<picobench::benchmark_impl>>>>
  *this_00;
  benchmark_impl *b;
  _Head_base<0UL,_picobench::benchmark_impl_*,_false> local_20;
  
  local_20._M_head_impl = (benchmark_impl *)operator_new(0x60);
  ((local_20._M_head_impl)->super_benchmark)._name = name;
  ((local_20._M_head_impl)->super_benchmark)._proc = proc;
  ((local_20._M_head_impl)->super_benchmark)._baseline = false;
  ((local_20._M_head_impl)->super_benchmark)._user_data = 0;
  ((local_20._M_head_impl)->super_benchmark)._state_iterations.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  *(pointer *)
   ((long)&((local_20._M_head_impl)->super_benchmark)._state_iterations.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data + 8) =
       (pointer)0x0;
  *(pointer *)
   ((long)&((local_20._M_head_impl)->super_benchmark)._state_iterations.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data + 0x10) =
       (pointer)0x0;
  ((local_20._M_head_impl)->super_benchmark)._samples = 0;
  ((local_20._M_head_impl)->_states).
  super__Vector_base<picobench::state,_std::allocator<picobench::state>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_20._M_head_impl)->_states).
  super__Vector_base<picobench::state,_std::allocator<picobench::state>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ((local_20._M_head_impl)->_states).
  super__Vector_base<picobench::state,_std::allocator<picobench::state>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ((local_20._M_head_impl)->_istate)._M_current = (state *)0x0;
  this_00 = (vector<std::unique_ptr<picobench::benchmark_impl,std::default_delete<picobench::benchmark_impl>>,std::allocator<std::unique_ptr<picobench::benchmark_impl,std::default_delete<picobench::benchmark_impl>>>>
             *)benchmarks_for_current_suite(this);
  __position._M_current =
       *(unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_> **)
        (this_00 + 8);
  if (__position._M_current ==
      *(unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_> **)
       (this_00 + 0x10)) {
    std::
    vector<std::unique_ptr<picobench::benchmark_impl,std::default_delete<picobench::benchmark_impl>>,std::allocator<std::unique_ptr<picobench::benchmark_impl,std::default_delete<picobench::benchmark_impl>>>>
    ::_M_realloc_insert<picobench::benchmark_impl*&>(this_00,__position,&local_20._M_head_impl);
  }
  else {
    ((__position._M_current)->_M_t).
    super___uniq_ptr_impl<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>
    ._M_t.
    super__Tuple_impl<0UL,_picobench::benchmark_impl_*,_std::default_delete<picobench::benchmark_impl>_>
    .super__Head_base<0UL,_picobench::benchmark_impl_*,_false>._M_head_impl = local_20._M_head_impl;
    *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
  }
  return &(local_20._M_head_impl)->super_benchmark;
}

Assistant:

benchmark& add_benchmark(const char* name, benchmark_proc proc)
    {
        auto b = new benchmark_impl(name, proc);
        benchmarks_for_current_suite().emplace_back(b);
        return *b;
    }